

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O0

void __thiscall OPL::DOSBox::DBOPL::Channel::SetChanData(Channel *this,Chip *chip,Bit32u data)

{
  uint uVar1;
  Operator *pOVar2;
  Bit32u change;
  Bit32u data_local;
  Chip *chip_local;
  Channel *this_local;
  
  uVar1 = this->chanData ^ data;
  this->chanData = data;
  pOVar2 = Op(this,0);
  pOVar2->chanData = data;
  pOVar2 = Op(this,1);
  pOVar2->chanData = data;
  pOVar2 = Op(this,0);
  Operator::UpdateFrequency(pOVar2);
  pOVar2 = Op(this,1);
  Operator::UpdateFrequency(pOVar2);
  if ((uVar1 & 0xff0000) != 0) {
    pOVar2 = Op(this,0);
    Operator::UpdateAttenuation(pOVar2);
    pOVar2 = Op(this,1);
    Operator::UpdateAttenuation(pOVar2);
  }
  if ((uVar1 & 0xff000000) != 0) {
    pOVar2 = Op(this,0);
    Operator::UpdateRates(pOVar2,chip);
    pOVar2 = Op(this,1);
    Operator::UpdateRates(pOVar2,chip);
  }
  return;
}

Assistant:

void Channel::SetChanData( const Chip* chip, Bit32u data ) {
	Bit32u change = chanData ^ data;
	chanData = data;
	Op( 0 )->chanData = data;
	Op( 1 )->chanData = data;
	//Since a frequency update triggered this, always update frequency
	Op( 0 )->UpdateFrequency();
	Op( 1 )->UpdateFrequency();
	if ( change & ( 0xff << SHIFT_KSLBASE ) ) {
		Op( 0 )->UpdateAttenuation();
		Op( 1 )->UpdateAttenuation();
	}
	if ( change & ( 0xff << SHIFT_KEYCODE ) ) {
		Op( 0 )->UpdateRates( chip );
		Op( 1 )->UpdateRates( chip );
	}
}